

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::checkCallGraphBodies
          (TIntermediate *this,TInfoSink *infoSink,bool keepUncalled)

{
  TGraph *pTVar1;
  bool bVar2;
  TIntermediate *pTVar3;
  TInfoSink *pTVar4;
  TIntermediate *this_00;
  TInfoSink *infoSink_00;
  int iVar5;
  int iVar6;
  _List_node_base *p_Var7;
  undefined4 extraout_var;
  long lVar8;
  long lVar9;
  long *plVar10;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar11;
  undefined4 extraout_var_00;
  TString *deadCaller;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  _Var12;
  undefined7 in_register_00000011;
  _List_node_base *p_Var13;
  byte bVar14;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  __last;
  difference_type __n;
  ulong uVar15;
  allocator_type local_79;
  TIntermediate *local_78;
  undefined4 local_6c;
  TInfoSink *local_68;
  undefined8 local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_6c = (undefined4)CONCAT71(in_register_00000011,keepUncalled);
  pTVar1 = &this->callGraph;
  for (p_Var7 = (this->callGraph).super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>.
                _M_impl._M_node.super__List_node_base._M_next; p_Var7 != (_List_node_base *)pTVar1;
      p_Var7 = p_Var7->_M_next) {
    *(undefined1 *)&p_Var7[6]._M_next = 0;
    *(undefined4 *)((long)&p_Var7[6]._M_next + 4) = 0xffffffff;
  }
  local_78 = this;
  local_68 = infoSink;
  iVar5 = (*this->treeRoot->_vptr_TIntermNode[6])();
  lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 400))
                    ((long *)CONCAT44(extraout_var,iVar5));
  local_60 = CONCAT71(local_60._1_7_,1);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,*(long *)(lVar8 + 0x10) - *(long *)(lVar8 + 8) >> 3,(bool *)&local_60,
             &local_79);
  lVar9 = *(long *)(lVar8 + 8);
  if (0 < (int)((ulong)(*(long *)(lVar8 + 0x10) - lVar9) >> 3)) {
    uVar15 = 0;
    do {
      plVar10 = (long *)(**(code **)(**(long **)(lVar9 + uVar15 * 8) + 0x30))();
      if ((plVar10 != (long *)0x0) && ((int)plVar10[0x17] == 5)) {
        pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*plVar10 + 0x1a8))(plVar10);
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (pbVar11,(local_78->entryPointMangledName)._M_dataplus._M_p);
        if (iVar5 != 0) {
          bVar14 = (byte)uVar15 & 0x3f;
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6 & 0x3ffffff] =
               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6 & 0x3ffffff] &
               (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
        }
        for (p_Var7 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>).
                      _M_impl._M_node.super__List_node_base._M_next;
            p_Var7 != (_List_node_base *)pTVar1; p_Var7 = p_Var7->_M_next) {
          pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*plVar10 + 0x1a8))(plVar10);
          iVar5 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)&p_Var7[3]._M_prev,pbVar11);
          if (iVar5 == 0) {
            *(int *)((long)&p_Var7[6]._M_next + 4) = (int)uVar15;
          }
        }
      }
      uVar15 = uVar15 + 1;
      lVar9 = *(long *)(lVar8 + 8);
    } while ((long)uVar15 < (long)(int)((ulong)(*(long *)(lVar8 + 0x10) - lVar9) >> 3));
  }
  pTVar3 = local_78;
  p_Var7 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)pTVar1) {
    do {
      iVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)(p_Var7 + 1),(pTVar3->entryPointMangledName)._M_dataplus._M_p);
      if (iVar5 == 0) {
        *(undefined1 *)&p_Var7[6]._M_next = 1;
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != (_List_node_base *)pTVar1);
    p_Var7 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>)._M_impl.
             _M_node.super__List_node_base._M_next;
  }
  pTVar3 = local_78;
  pTVar4 = local_68;
  if (p_Var7 != (_List_node_base *)pTVar1) {
    bVar14 = 0;
    do {
      do {
        if ((*(char *)&p_Var7[6]._M_next == '\x01') &&
           (p_Var13 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>).
                      _M_impl._M_node.super__List_node_base._M_next,
           p_Var13 != (_List_node_base *)pTVar1)) {
          do {
            if ((*(char *)&p_Var13[6]._M_next == '\0') &&
               (iVar5 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)&p_Var7[3]._M_prev,
                                (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)(p_Var13 + 1)), iVar5 == 0)) {
              *(undefined1 *)&p_Var13[6]._M_next = 1;
              bVar14 = 1;
            }
            p_Var13 = p_Var13->_M_next;
          } while (p_Var13 != (_List_node_base *)pTVar1);
        }
        p_Var7 = p_Var7->_M_next;
      } while (p_Var7 != (_List_node_base *)pTVar1);
      p_Var7 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>)._M_impl.
               _M_node.super__List_node_base._M_next;
      bVar2 = (bool)(bVar14 & p_Var7 != (_List_node_base *)pTVar1);
      bVar14 = 0;
      pTVar3 = local_78;
      pTVar4 = local_68;
    } while (bVar2);
  }
  for (; infoSink_00 = local_68, this_00 = local_78, local_78 = pTVar3, local_68 = pTVar4,
      p_Var7 != (_List_node_base *)pTVar1; p_Var7 = p_Var7->_M_next) {
    if (*(char *)&p_Var7[6]._M_next == '\x01') {
      iVar5 = *(int *)((long)&p_Var7[6]._M_next + 4);
      if ((long)iVar5 == 0xffffffffffffffff) {
        error(this_00,infoSink_00,"No function definition (body) found: ",EShLangCount);
        TInfoSinkBase::append(&infoSink_00->info,"    ");
        TInfoSinkBase::append(&infoSink_00->info,(TString *)&p_Var7[3]._M_prev);
        TInfoSinkBase::append(&infoSink_00->info,"\n");
      }
      else {
        iVar6 = iVar5 + 0x3f;
        if (-1 < iVar5) {
          iVar6 = iVar5;
        }
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [(long)(iVar6 >> 6) +
         ((ulong)(((long)iVar5 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
             local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)(iVar6 >> 6) +
              ((ulong)(((long)iVar5 & 0x800000000000003fU) < 0x8000000000000001) - 1)] |
             1L << ((byte)iVar5 & 0x3f);
        local_78 = pTVar3;
        local_68 = pTVar4;
      }
    }
    pTVar3 = local_78;
    pTVar4 = local_68;
    local_68 = infoSink_00;
    local_78 = this_00;
  }
  if ((char)local_6c == '\0') {
    _Var12._M_current = *(TIntermNode ***)(lVar8 + 8);
    __last._M_current = *(TIntermNode ***)(lVar8 + 0x10);
    if (0 < (int)((ulong)((long)__last._M_current - (long)_Var12._M_current) >> 3)) {
      uVar15 = 0;
      do {
        if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6 & 0x3ffffff] >> (uVar15 & 0x3f) & 1)
            == 0) {
          iVar5 = (*_Var12._M_current[uVar15]->_vptr_TIntermNode[6])();
          deadCaller = (TString *)
                       (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x1a8))
                                 ((long *)CONCAT44(extraout_var_00,iVar5));
          resetTopLevelUncalledStatus(this_00,deadCaller);
          *(undefined8 *)(*(long *)(lVar8 + 8) + uVar15 * 8) = 0;
          _Var12._M_current = *(TIntermNode ***)(lVar8 + 8);
          __last._M_current = *(TIntermNode ***)(lVar8 + 0x10);
        }
        uVar15 = uVar15 + 1;
      } while ((long)uVar15 <
               (long)(int)((ulong)((long)__last._M_current - (long)_Var12._M_current) >> 3));
    }
    local_60 = 0;
    _Var12 = std::
             __remove_if<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<decltype(nullptr)const>>
                       (_Var12,__last,(_Iter_equals_val<const_std::nullptr_t>)&local_60);
    if (_Var12._M_current != *(TIntermNode ***)(lVar8 + 0x10)) {
      *(TIntermNode ***)(lVar8 + 0x10) = _Var12._M_current;
    }
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void TIntermediate::checkCallGraphBodies(TInfoSink& infoSink, bool keepUncalled)
{
    // Clear fields we'll use for this.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        call->visited = false;
        call->calleeBodyPosition = -1;
    }

    // The top level of the AST includes function definitions (bodies).
    // Compare these to function calls in the call graph.
    // We'll end up knowing which have bodies, and if so,
    // how to map the call-graph node to the location in the AST.
    TIntermSequence &functionSequence = getTreeRoot()->getAsAggregate()->getSequence();
    std::vector<bool> reachable(functionSequence.size(), true); // so that non-functions are reachable
    for (int f = 0; f < (int)functionSequence.size(); ++f) {
        glslang::TIntermAggregate* node = functionSequence[f]->getAsAggregate();
        if (node && (node->getOp() == glslang::EOpFunction)) {
            if (node->getName().compare(getEntryPointMangledName().c_str()) != 0)
                reachable[f] = false; // so that function bodies are unreachable, until proven otherwise
            for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
                if (call->callee == node->getName())
                    call->calleeBodyPosition = f;
            }
        }
    }

    // Start call-graph traversal by visiting the entry point nodes.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        if (call->caller.compare(getEntryPointMangledName().c_str()) == 0)
            call->visited = true;
    }

    // Propagate 'visited' through the call-graph to every part of the graph it
    // can reach (seeded with the entry-point setting above).
    bool changed;
    do {
        changed = false;
        for (auto call1 = callGraph.begin(); call1 != callGraph.end(); ++call1) {
            if (call1->visited) {
                for (TGraph::iterator call2 = callGraph.begin(); call2 != callGraph.end(); ++call2) {
                    if (! call2->visited) {
                        if (call1->callee == call2->caller) {
                            changed = true;
                            call2->visited = true;
                        }
                    }
                }
            }
        }
    } while (changed);

    // Any call-graph node set to visited but without a callee body is an error.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        if (call->visited) {
            if (call->calleeBodyPosition == -1) {
                error(infoSink, "No function definition (body) found: ");
                infoSink.info << "    " << call->callee << "\n";
            } else
                reachable[call->calleeBodyPosition] = true;
        }
    }

    // Bodies in the AST not reached by the call graph are dead;
    // clear them out, since they can't be reached and also can't
    // be translated further due to possibility of being ill defined.
    if (! keepUncalled) {
        for (int f = 0; f < (int)functionSequence.size(); ++f) {
            if (! reachable[f])
            {
                resetTopLevelUncalledStatus(functionSequence[f]->getAsAggregate()->getName());
                functionSequence[f] = nullptr;
            }
        }
        functionSequence.erase(std::remove(functionSequence.begin(), functionSequence.end(), nullptr), functionSequence.end());
    }
}